

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall
Json::OurReader::parse(OurReader *this,char *beginDoc,char *endDoc,Value *root,bool collectComments)

{
  bool bVar1;
  ulong uVar2;
  allocator local_b9;
  string local_b8;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  Token token;
  Value *pVStack_40;
  bool successful;
  byte local_31;
  Value *pVStack_30;
  bool collectComments_local;
  Value *root_local;
  char *endDoc_local;
  char *beginDoc_local;
  OurReader *this_local;
  
  local_31 = collectComments;
  if (((this->features_).allowComments_ & 1U) == 0) {
    local_31 = 0;
  }
  this->begin_ = beginDoc;
  this->end_ = endDoc;
  this->collectComments_ = (bool)(local_31 & 1);
  this->current_ = this->begin_;
  this->lastValueEnd_ = (Location)0x0;
  this->lastValue_ = (Value *)0x0;
  pVStack_30 = root;
  root_local = (Value *)endDoc;
  endDoc_local = beginDoc;
  beginDoc_local = (char *)this;
  std::__cxx11::string::operator=((string *)&this->commentsBefore_,"");
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::clear
            (&this->errors_);
  while (bVar1 = std::
                 stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::
                 empty(&this->nodes_), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              (&this->nodes_);
  }
  pVStack_40 = pVStack_30;
  std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
            (&this->nodes_,&stack0xffffffffffffffc0);
  this->stackDepth_ = 0;
  token.end_._7_1_ = readValue(this);
  skipCommentTokens(this,(Token *)local_60);
  if ((((this->features_).failIfExtra_ & 1U) == 0) ||
     (((((this->features_).strictRoot_ & 1U) == 0 && (local_60._0_4_ == tokenError)) ||
      (local_60._0_4_ == tokenEndOfStream)))) {
    if (((this->collectComments_ & 1U) != 0) &&
       (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
      Value::setComment(pVStack_30,&this->commentsBefore_,commentAfter);
    }
    if (((((this->features_).strictRoot_ & 1U) == 0) || (bVar1 = Value::isArray(pVStack_30), bVar1))
       || (bVar1 = Value::isObject(pVStack_30), bVar1)) {
      this_local._7_1_ = (bool)(token.end_._7_1_ & 1);
    }
    else {
      local_60._0_4_ = tokenError;
      token._0_8_ = endDoc_local;
      token.start_ = (Location)root_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b8,
                 "A valid JSON document must be either an array or an object value.",&local_b9);
      addError(this,&local_b8,(Token *)local_60,(Location)0x0);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      this_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_80,"Extra non-whitespace after JSON value.",&local_81);
    addError(this,&local_80,(Token *)local_60,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool OurReader::parse(const char* beginDoc,
                   const char* endDoc,
                   Value& root,
                   bool collectComments) {
  if (!features_.allowComments_) {
    collectComments = false;
  }

  begin_ = beginDoc;
  end_ = endDoc;
  collectComments_ = collectComments;
  current_ = begin_;
  lastValueEnd_ = 0;
  lastValue_ = 0;
  commentsBefore_ = "";
  errors_.clear();
  while (!nodes_.empty())
    nodes_.pop();
  nodes_.push(&root);

  stackDepth_ = 0;
  bool successful = readValue();
  Token token;
  skipCommentTokens(token);
  if (features_.failIfExtra_) {
    if ((features_.strictRoot_ || token.type_ != tokenError) && token.type_ != tokenEndOfStream) {
      addError("Extra non-whitespace after JSON value.", token);
      return false;
    }
  }
  if (collectComments_ && !commentsBefore_.empty())
    root.setComment(commentsBefore_, commentAfter);
  if (features_.strictRoot_) {
    if (!root.isArray() && !root.isObject()) {
      // Set error location to start of doc, ideally should be first token found
      // in doc
      token.type_ = tokenError;
      token.start_ = beginDoc;
      token.end_ = endDoc;
      addError(
          "A valid JSON document must be either an array or an object value.",
          token);
      return false;
    }
  }
  return successful;
}